

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O3

QSqlDatabase __thiscall
QSqlDatabasePrivate::database(QSqlDatabasePrivate *this,QString *name,bool open)

{
  QSqlDriver *pQVar1;
  QDebug this_00;
  char cVar2;
  Type *key;
  long lVar3;
  long lVar4;
  QSqlDatabasePrivate *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QSqlDatabase db;
  undefined1 local_78 [20];
  undefined8 uStack_64;
  undefined4 local_5c;
  char *local_58;
  QDebug local_50;
  undefined1 local_48 [16];
  QHash<QString,_QSqlDatabase> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = this;
  cVar2 = QCoreApplication::instanceExists();
  if (cVar2 == '\0') {
    database(this);
    goto LAB_001186f0;
  }
  local_48._0_8_ = (__base_type)0xaaaaaaaaaaaaaaaa;
  key = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
        ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
                      *)this_01);
  anon_unknown.dwarf_44494::QtSqlGlobals::connection((QtSqlGlobals *)local_48,(QString *)key);
  pQVar1 = *(QSqlDriver **)(local_48._0_8_ + 8);
  if (pQVar1 == (QSqlDriver *)0x0) {
LAB_001186d9:
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this,(QSqlDatabase *)local_48);
  }
  else {
    shared_null();
    if (pQVar1 == shared_null::n.driver) goto LAB_001186d9;
    lVar3 = QObject::thread();
    lVar4 = QThread::currentThread();
    if (lVar3 == lVar4) {
      if (open) {
        cVar2 = (**(code **)(**(long **)(local_48._0_8_ + 8) + 0x60))();
        if (cVar2 == '\0') {
          cVar2 = (**(code **)(**(long **)(local_48._0_8_ + 8) + 0xd0))
                            (*(long **)(local_48._0_8_ + 8),(__pointer_type)(local_48._0_8_ + 0x10),
                             (__pointer_type)(local_48._0_8_ + 0x28),
                             (__pointer_type)(local_48._0_8_ + 0x40),
                             (__pointer_type)(local_48._0_8_ + 0x58),
                             *(undefined4 *)(local_48._0_8_ + 0x88),
                             (__pointer_type)(local_48._0_8_ + 0x90));
          if (cVar2 == '\0') {
            lcSqlDb();
            if (((byte)lcSqlDb::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
                0) {
              local_78._8_4_ = 2;
              local_78._12_8_ = 0;
              uStack_64 = 0;
              local_5c = 0;
              local_58 = lcSqlDb::category.name;
              QMessageLogger::warning();
              this_00.stream = local_50.stream;
              QVar5.m_data = (storage_type *)0x37;
              QVar5.m_size = (qsizetype)(local_48 + 8);
              QString::fromUtf8(QVar5);
              QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)(local_48 + 8));
              if ((Data *)local_48._8_8_ != (Data *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_48._8_8_,2,0x10);
                }
              }
              if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_50.stream,' ');
              }
              QSqlDriver::lastError((QSqlDriver *)local_78);
              QSqlError::text((QString *)(local_48 + 8),(QSqlError *)local_78);
              if (local_38.d == (Data *)0x0) {
                local_38.d = (Data *)&QString::_empty;
              }
              QDebug::putString((QChar *)&local_50,(ulong)local_38.d);
              if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_50.stream,' ');
              }
              if ((Data *)local_48._8_8_ != (Data *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_48._8_8_,2,0x10);
                }
              }
              QSqlError::~QSqlError((QSqlError *)local_78);
              QDebug::~QDebug(&local_50);
            }
          }
        }
      }
      goto LAB_001186d9;
    }
    lcSqlDb();
    if (((byte)lcSqlDb::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      database();
    }
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)this);
  }
  QSqlDatabase::~QSqlDatabase((QSqlDatabase *)local_48);
LAB_001186f0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSqlDatabase)this;
  }
  __stack_chk_fail();
}

Assistant:

QSqlDatabase QSqlDatabasePrivate::database(const QString& name, bool open)
{
    CHECK_QCOREAPPLICATION_RETVAL
    QSqlDatabase db = s_sqlGlobals()->connection(name);
    if (!db.isValid())
        return db;
    if (db.driver()->thread() != QThread::currentThread()) {
        qCWarning(lcSqlDb, "QSqlDatabasePrivate::database: requested database does not belong to the calling thread.");
        return QSqlDatabase();
    }

    if (open && !db.isOpen()) {
        if (!db.open())
            qCWarning(lcSqlDb) << "QSqlDatabasePrivate::database: unable to open database:" << db.lastError().text();

    }
    return db;
}